

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O1

void __thiscall
slang::ast::PatternCaseStatement::visitExprs<always_ff_assignment_outside_conditional::MainVisitor&>
          (PatternCaseStatement *this,AlwaysFFVisitor *visitor)

{
  pointer pIVar1;
  size_t sVar2;
  Expression *this_00;
  ItemGroup *item;
  pointer pIVar3;
  
  Expression::
  visitExpression<slang::ast::Expression_const,always_ff_assignment_outside_conditional::MainVisitor&>
            (this->expr,this->expr,visitor);
  sVar2 = (this->items)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    pIVar3 = (this->items)._M_ptr;
    pIVar1 = pIVar3 + sVar2;
    do {
      Pattern::visit<always_ff_assignment_outside_conditional::MainVisitor>
                ((pIVar3->pattern).ptr,visitor);
      this_00 = pIVar3->filter;
      if (this_00 != (Expression *)0x0) {
        Expression::
        visitExpression<slang::ast::Expression_const,always_ff_assignment_outside_conditional::MainVisitor&>
                  (this_00,this_00,visitor);
      }
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar1);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            item.pattern->visit(visitor);
            if (item.filter)
                item.filter->visit(visitor);
        }
    }